

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O1

StatusCode __thiscall HttpConn::parseBody(HttpConn *this)

{
  size_type sVar1;
  char *__nptr;
  int iVar2;
  StatusCode SVar3;
  mapped_type *pmVar4;
  int *piVar5;
  long lVar6;
  undefined8 uVar7;
  pointer pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *local_88;
  key_type local_80;
  key_type local_60;
  HttpConn *local_40;
  int local_34;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Content-Length","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->headers_,&local_60);
  sVar1 = pmVar4->_M_string_length;
  if (sVar1 == 0) {
    lVar6 = 0;
LAB_0011843c:
    paVar9 = &local_60.field_2;
    if ((sVar1 != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2)) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar9) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    iVar2 = (int)lVar6;
    SVar3 = Wait;
    if (this->checked_idx_ + iVar2 <= this->read_idx_) {
      pcVar8 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + this->checked_idx_;
      local_60._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar8,pcVar8 + iVar2);
      std::__cxx11::string::operator=((string *)&this->requestBody_,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar9) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      this->checked_idx_ = this->checked_idx_ + iVar2;
      SVar3 = OK;
    }
    return SVar3;
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Content-Length","");
  local_40 = this;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->headers_,&local_80);
  __nptr = (pmVar4->_M_dataplus)._M_p;
  piVar5 = __errno_location();
  local_34 = *piVar5;
  *piVar5 = 0;
  lVar6 = strtol(__nptr,&local_88,10);
  if (local_88 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar6 == lVar6) && (*piVar5 != 0x22)) {
    this = local_40;
    if (*piVar5 == 0) {
      *piVar5 = local_34;
    }
    goto LAB_0011843c;
  }
  uVar7 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

HttpConn::StatusCode HttpConn::parseBody() {
    int contentLen = headers_["Content-Length"].empty() ? 0 : std::stoi(headers_["Content-Length"]);
    if (read_idx_ >= contentLen + checked_idx_) {
        requestBody_ = std::string(readBuff_.data() + checked_idx_, readBuff_.data() + checked_idx_ + contentLen);
        checked_idx_ += contentLen;
        return OK;
    } 
    else return Wait;
}